

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filters.c
# Opt level: O0

void VerticalFilter_C(uint8_t *data,int width,int height,int stride,uint8_t *filtered_data)

{
  int in_ECX;
  int in_EDX;
  int in_ESI;
  undefined8 in_RDI;
  uint8_t *unaff_retaddr;
  int in_stack_00000010;
  
  DoVerticalFilter_C(unaff_retaddr,(int)((ulong)in_RDI >> 0x20),(int)in_RDI,in_ESI,in_EDX,in_ECX,
                     in_stack_00000010,filtered_data);
  return;
}

Assistant:

static void VerticalFilter_C(const uint8_t* data, int width, int height,
                             int stride, uint8_t* filtered_data) {
  DoVerticalFilter_C(data, width, height, stride, 0, height, 0, filtered_data);
}